

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::updatePivots(HEkkDual *this)

{
  HEkk *in_RDI;
  double in_stack_00000010;
  HighsInt in_stack_0000001c;
  undefined4 in_stack_00000030;
  HighsInt in_stack_00000034;
  HighsInt in_stack_00000038;
  HighsInt in_stack_0000003c;
  HEkk *in_stack_00000040;
  HVector *in_stack_00000048;
  HEkk *in_stack_00000050;
  HighsInt in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffdc;
  HEkk *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (*(int *)&(in_RDI->analysis_).log_options.user_callback.super__Function_base._M_manager == 0) {
    HEkk::transformForUpdate
              (in_RDI,(HVector *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (HVector *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(HighsInt *)0x78a711);
    HEkk::updatePivots(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000034);
    *(int *)&in_RDI->timer_[0x67].clock_start.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage =
         *(int *)&in_RDI->timer_[0x67].clock_start.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1;
    HEkk::updateFactor(in_stack_00000050,in_stack_00000048,(HVector *)in_stack_00000040,
                       (HighsInt *)CONCAT44(in_stack_0000003c,in_stack_00000038),
                       (HighsInt *)CONCAT44(in_stack_00000034,in_stack_00000030));
    HEkk::updateMatrix(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                      );
    HEkkDualRow::deleteFreelist((HEkkDualRow *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)
               &in_RDI->timer_[0x47].clock_start.super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (long)*(int *)((long)&(in_RDI->analysis_).cleanup_dual_step_distribution.count_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish + 4));
    HEkkDualRHS::updatePivots((HEkkDualRHS *)this,in_stack_0000001c,in_stack_00000010);
  }
  return;
}

Assistant:

void HEkkDual::updatePivots() {
  // UPDATE
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  // Transform the vectors used in updateFactor if the simplex NLA involves
  // scaling
  ekk_instance_.transformForUpdate(&col_aq, &row_ep, variable_in, &row_out);
  //
  // Update the sets of indices of basic and nonbasic variables
  //
  // debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "Before
  // update_pivots");
  ekk_instance_.updatePivots(variable_in, row_out, move_out);
  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "After
  //  update_pivots");
  //
  ekk_instance_.iteration_count_++;
  //
  // Update the invertible representation of the basis matrix
  ekk_instance_.updateFactor(&col_aq, &row_ep, &row_out, &rebuild_reason);
  //
  // Update the row-wise representation of the nonbasic columns
  ekk_instance_.updateMatrix(variable_in, variable_out);
  //
  // Delete Freelist entry for variable_in
  dualRow.deleteFreelist(variable_in);
  //
  // Update the primal value for the row where the basis change has
  // occurred, and set the corresponding primal infeasibility value in
  // dualRHS.work_infeasibility
  dualRHS.updatePivots(
      row_out, ekk_instance_.info_.workValue_[variable_in] + theta_primal);

  /*
  // Determine whether to reinvert based on the synthetic clock
  bool reinvert_syntheticClock = total_synthetic_tick >= build_synthetic_tick;
  const bool performed_min_updates =
      ekk_instance_.info_.update_count >=
      kSyntheticTickReinversionMinUpdateCount;
  if (reinvert_syntheticClock && performed_min_updates)
    rebuild_reason = kRebuildReasonSyntheticClockSaysInvert;
  */
}